

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  byte abStack_12 [5];
  undefined2 local_d;
  char local_b [3];
  char *local_8;
  
  lVar1 = (msg->time).__d.__r;
  uVar5 = lVar1 - (this->last_message_time_).__d.__r;
  uVar3 = 0;
  if (0 < (long)uVar5) {
    uVar3 = uVar5;
  }
  (this->last_message_time_).__d.__r = lVar1;
  pcVar4 = local_b;
  if (99 < (long)uVar5) {
    do {
      uVar3 = uVar5 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(fmt::v8::detail::basic_data<void>::digits + (uVar5 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar2 = 9999 < uVar5;
      uVar5 = uVar3;
    } while (bVar2);
  }
  if (uVar3 < 10) {
    pcVar4[-1] = (byte)uVar3 | 0x30;
    local_8 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) =
         *(undefined2 *)(fmt::v8::detail::basic_data<void>::digits + uVar3 * 2);
    local_8 = pcVar4 + -2;
  }
  fmt::v8::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_8,local_b);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }